

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

int nni_posix_resolv_sysinit(nng_init_params *params)

{
  bool bVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  void *arg;
  long lVar6;
  
  nni_mtx_init(&resolv_mtx);
  nni_cv_init(&resolv_cv,&resolv_mtx);
  resolv_fini = 0;
  nni_aio_list_init(&resolv_aios);
  uVar3 = 1;
  if (1 < params->num_resolver_threads) {
    uVar3 = params->num_resolver_threads;
  }
  resolv_num_thr = uVar3;
  params->num_resolver_threads = uVar3;
  resolv_thrs = (nni_thr *)nni_zalloc((ulong)uVar3 * 0x98);
  resolv_active = (nni_aio **)nni_zalloc((long)resolv_num_thr << 3);
  if (resolv_active == (nni_aio **)0x0 || resolv_thrs == (nni_thr *)0x0) {
    nni_posix_resolv_sysfini();
    iVar4 = 2;
  }
  else {
    bVar1 = 0 < resolv_num_thr;
    if (0 < resolv_num_thr) {
      lVar5 = 0;
      arg = (void *)0x0;
      do {
        uVar2 = nni_thr_init((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar5),resolv_worker,arg);
        if (uVar2 != 0) {
          nni_posix_resolv_sysfini();
          params = (nng_init_params *)(ulong)uVar2;
          break;
        }
        arg = (void *)((long)arg + 1);
        lVar5 = lVar5 + 0x98;
        bVar1 = (long)arg < (long)resolv_num_thr;
      } while ((long)arg < (long)resolv_num_thr);
    }
    iVar4 = (int)params;
    if (!bVar1) {
      if (resolv_num_thr < 1) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        lVar5 = 0;
        lVar6 = 0;
        do {
          nni_thr_run((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar5));
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x98;
        } while (lVar6 < resolv_num_thr);
      }
    }
  }
  return iVar4;
}

Assistant:

int
nni_posix_resolv_sysinit(nng_init_params *params)
{
	nni_mtx_init(&resolv_mtx);
	nni_cv_init(&resolv_cv, &resolv_mtx);
	resolv_fini = false;
	nni_aio_list_init(&resolv_aios);

	resolv_num_thr = params->num_resolver_threads;
	if (resolv_num_thr < 1) {
		resolv_num_thr = 1;
	}
	params->num_resolver_threads = resolv_num_thr;
	// no limit on the maximum for now
	resolv_thrs   = NNI_ALLOC_STRUCTS(resolv_thrs, resolv_num_thr);
	resolv_active = nni_zalloc(sizeof(nni_aio *) * resolv_num_thr);
	if (resolv_thrs == NULL || resolv_active == NULL) {
		nni_posix_resolv_sysfini();
		return (NNG_ENOMEM);
	}

	for (int i = 0; i < resolv_num_thr; i++) {
		int rv = nni_thr_init(
		    &resolv_thrs[i], resolv_worker, (void *) (intptr_t) i);
		if (rv != 0) {
			nni_posix_resolv_sysfini();
			return (rv);
		}
	}
	for (int i = 0; i < resolv_num_thr; i++) {
		nni_thr_run(&resolv_thrs[i]);
	}

	return (0);
}